

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * the(char *str)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *__dest;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  int l;
  char *called;
  char *named;
  char *tmp;
  boolean insert_the;
  char *buf;
  char *str_local;
  
  __dest = nextobuf();
  bVar1 = false;
  iVar3 = strncasecmp(str,"the ",4);
  if (iVar3 == 0) {
    cVar2 = lowc(*str);
    *__dest = cVar2;
    strcpy(__dest + 1,str + 1);
  }
  else {
    if ((*str < 'A') || ('Z' < *str)) {
      bVar1 = true;
    }
    else {
      named = strrchr(str,0x20);
      if (((named == (char *)0x0) && (named = strrchr(str,0x2d), named == (char *)0x0)) ||
         (('@' < named[1] && (named[1] < '[')))) {
        if ((named != (char *)0x0) && (pcVar4 = strchr(str,0x20), pcVar4 < named)) {
          pcVar4 = strstri(str," of ");
          called = strstri(str," named ");
          pcVar5 = strstri(str," called ");
          if ((pcVar5 != (char *)0x0) && ((called == (char *)0x0 || (pcVar5 < called)))) {
            called = pcVar5;
          }
          if ((pcVar4 == (char *)0x0) || ((called != (char *)0x0 && (called <= pcVar4)))) {
            if (called == (char *)0x0) {
              sVar6 = strlen(str);
              if ((0x1e < (int)sVar6) &&
                 (iVar3 = strcmp(str + ((int)sVar6 + -0x1f),"Platinum Yendorian Express Card"),
                 iVar3 == 0)) {
                bVar1 = true;
              }
            }
          }
          else {
            bVar1 = true;
          }
        }
      }
      else {
        bVar1 = true;
      }
    }
    if (bVar1) {
      strcpy(__dest,"the ");
    }
    else {
      *__dest = '\0';
    }
    strcat(__dest,str);
  }
  return __dest;
}

Assistant:

char *the(const char *str)
{
	char *buf = nextobuf();
	boolean insert_the = FALSE;

	if (!strncmpi(str, "the ", 4)) {
	    buf[0] = lowc(*str);
	    strcpy(&buf[1], str+1);
	    return buf;
	} else if (*str < 'A' || *str > 'Z') {
	    /* not a proper name, needs an article */
	    insert_the = TRUE;
	} else {
	    /* Probably a proper name, might not need an article */
	    char *tmp, *named, *called;
	    int l;

	    /* some objects have capitalized adjectives in their names */
	    if (((tmp = strrchr(str, ' ')) || (tmp = strrchr(str, '-'))) &&
	       (tmp[1] < 'A' || tmp[1] > 'Z'))
		insert_the = TRUE;
	    else if (tmp && strchr(str, ' ') < tmp) {	/* has spaces */
		/* it needs an article if the name contains "of" */
		tmp = strstri(str, " of ");
		named = strstri(str, " named ");
		called = strstri(str, " called ");
		if (called && (!named || called < named)) named = called;

		if (tmp && (!named || tmp < named))	/* found an "of" */
		    insert_the = TRUE;
		/* stupid special case: lacks "of" but needs "the" */
		else if (!named && (l = strlen(str)) >= 31 &&
		      !strcmp(&str[l - 31], "Platinum Yendorian Express Card"))
		    insert_the = TRUE;
	    }
	}
	if (insert_the)
	    strcpy(buf, "the ");
	else
	    buf[0] = '\0';
	strcat(buf, str);

	return buf;
}